

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlDebugDumpNodeList(FILE *output,xmlNodePtr node,int depth)

{
  undefined1 local_c0 [8];
  xmlDebugCtxt ctxt;
  int depth_local;
  xmlNodePtr node_local;
  FILE *output_local;
  
  node_local = (xmlNodePtr)output;
  if (output == (FILE *)0x0) {
    node_local = _stdout;
  }
  ctxt.options = depth;
  xmlCtxtDumpInitCtxt((xmlDebugCtxtPtr)local_c0);
  local_c0 = (undefined1  [8])node_local;
  ctxt.shift[0x60] = (undefined1)ctxt.options;
  ctxt.shift[0x61] = ctxt.options._1_1_;
  ctxt.shift[0x62] = ctxt.options._2_1_;
  ctxt.shift[99] = ctxt.options._3_1_;
  xmlCtxtDumpNodeList((xmlDebugCtxtPtr)local_c0,node);
  xmlCtxtDumpCleanCtxt((xmlDebugCtxtPtr)local_c0);
  return;
}

Assistant:

void
xmlDebugDumpNodeList(FILE * output, xmlNodePtr node, int depth)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpNodeList(&ctxt, node);
    xmlCtxtDumpCleanCtxt(&ctxt);
}